

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O0

BndryRegister * __thiscall
amrex::BndryRegister::linComb
          (BndryRegister *this,Real a,MultiFab *mfa,int a_comp,Real b,MultiFab *mfb,int b_comp,
          int dest_comp,int num_comp,int n_ghost)

{
  void *pvVar1;
  BndryRegister *in_RDI;
  undefined4 in_stack_00000008;
  OrientationIter face;
  int in_stack_000006b8;
  int in_stack_000006bc;
  MultiFab *in_stack_000006c0;
  Real in_stack_000006c8;
  int in_stack_000006d4;
  MultiFab *in_stack_000006d8;
  Real in_stack_000006e0;
  FabSet *in_stack_000006e8;
  int in_stack_000008d0;
  int in_stack_000008d8;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Orientation local_40;
  OrientationIter local_3c [15];
  
  OrientationIter::OrientationIter(local_3c);
  while( true ) {
    pvVar1 = OrientationIter::operator_cast_to_void_(local_3c);
    if (pvVar1 == (void *)0x0) break;
    local_40 = OrientationIter::operator()
                         ((OrientationIter *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    Orientation::operator_cast_to_int(&local_40);
    in_stack_ffffffffffffff98 = in_stack_00000008;
    FabSet::linComb(in_stack_000006e8,in_stack_000006e0,in_stack_000006d8,in_stack_000006d4,
                    in_stack_000006c8,in_stack_000006c0,in_stack_000006bc,in_stack_000006b8,
                    in_stack_000008d0,in_stack_000008d8);
    OrientationIter::operator++(local_3c);
  }
  return in_RDI;
}

Assistant:

BndryRegister&
BndryRegister::linComb (Real            a,
                        const MultiFab& mfa,
                        int             a_comp,
                        Real            b,
                        const MultiFab& mfb,
                        int             b_comp,
                        int             dest_comp,
                        int             num_comp,
                        int             n_ghost)
{
    for (OrientationIter face; face; ++face)
    {
        bndry[face()].linComb(a,
                              mfa,
                              a_comp,
                              b,
                              mfb,
                              b_comp,
                              dest_comp,
                              num_comp,
                              n_ghost);
    }
    return *this;
}